

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O1

void __thiscall
ConfidentialValue_ConvertToConfidentialValue_Test::TestBody
          (ConfidentialValue_ConvertToConfidentialValue_Test *this)

{
  bool bVar1;
  char *message;
  Amount AVar2;
  AssertionResult gtest_ar;
  ByteData bytedata;
  AssertHelper AStack_68;
  string local_60;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  ByteData local_30;
  Amount local_18;
  
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_18.amount_ = AVar2.amount_;
  local_18.ignore_check_ = AVar2.ignore_check_;
  cfd::core::ConfidentialValue::ConvertToConfidentialValue(&local_30,&local_18);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_60,&local_30);
  testing::internal::CmpHelperSTREQ
            (local_40,"bytedata.GetHex().c_str()","\"010000000005f5e100\"",local_60._M_dataplus._M_p
             ,"010000000005f5e100");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x93,message);
    testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&AStack_68);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_60._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
      local_60._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ConfidentialValue, ConvertToConfidentialValue) {
  Amount amount = Amount::CreateBySatoshiAmount(100000000);
  ByteData bytedata = ConfidentialValue::ConvertToConfidentialValue(amount);
  EXPECT_STREQ(bytedata.GetHex().c_str(), "010000000005f5e100");
}